

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  StateVerifier *pSVar2;
  int iVar3;
  IsEnabledVerifier *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  GetBooleanVerifier *this_01;
  undefined4 extraout_var_00;
  GetIntegerVerifier *this_02;
  undefined4 extraout_var_01;
  GetInteger64Verifier *this_03;
  undefined4 extraout_var_02;
  GetFloatVerifier *this_04;
  undefined4 extraout_var_03;
  void *pvVar7;
  IsEnabledStateTestCase *this_05;
  char *pcVar8;
  long lVar9;
  ColorMaskTestCase *this_06;
  DepthWriteMaskTestCase *this_07;
  SampleCoverageInvertTestCase *this_08;
  InitialBooleanTestCase *pIVar10;
  TestNode *pTVar11;
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  StateVerifier *local_408;
  StateVerifier *verifier_8;
  int _verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  StateVerifier *local_3b8;
  StateVerifier *verifier_7;
  int _verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  StateVerifier *local_368;
  StateVerifier *verifier_6;
  int _verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  StateVerifier *local_318;
  StateVerifier *verifier_5;
  int _verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  StateVerifier *local_2c8;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  StateVerifier *local_278;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  StateVerifier *local_228;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  StateVerifier *local_1d8;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  StateVerifier *local_188;
  StateVerifier *verifier;
  int _verifierNdx;
  int testNdx;
  StateBoolean isEnableds [11];
  StateVerifier *normalVerifiers [4];
  StateVerifier *isEnabledVerifiers [5];
  BooleanStateQueryTests *this_local;
  
  this_00 = (IsEnabledVerifier *)operator_new(0x28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::IsEnabledVerifier::IsEnabledVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  this->m_verifierIsEnabled = this_00;
  this_01 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar3),pTVar6);
  this->m_verifierBoolean = this_01;
  this_02 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar3),pTVar6);
  this->m_verifierInteger = this_02;
  this_03 = (GetInteger64Verifier *)operator_new(0x28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_03,(Functions *)CONCAT44(extraout_var_02,iVar3),pTVar6);
  this->m_verifierInteger64 = this_03;
  this_04 = (GetFloatVerifier *)operator_new(0x28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_04,(Functions *)CONCAT44(extraout_var_03,iVar3),pTVar6);
  this->m_verifierFloat = this_04;
  normalVerifiers[3] = &this->m_verifierIsEnabled->super_StateVerifier;
  normalVerifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[1] = &this->m_verifierInteger64->super_StateVerifier;
  normalVerifiers[2] = &this->m_verifierFloat->super_StateVerifier;
  pvVar7 = memcpy(&_verifierNdx,&PTR_anon_var_dwarf_14c17b0_032a9820,0x108);
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 0xb) {
    for (verifier._0_4_ = 0; (int)verifier < 5; verifier._0_4_ = (int)verifier + 1) {
      local_188 = normalVerifiers[(long)(int)verifier + 3];
      this_05 = (IsEnabledStateTestCase *)operator_new(0xa8);
      pSVar2 = local_188;
      verifier_1._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)(int)verifier._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_1,pcVar8,(allocator<char> *)((long)&verifier_1 + 7));
      pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_188);
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_1,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)verifier._4_4_;
      Functional::anon_unknown_0::IsEnabledStateTestCase::IsEnabledStateTestCase
                (this_05,pCVar1,pSVar2,pcVar8,isEnableds[lVar9].name,
                 *(GLenum *)&isEnableds[lVar9].description,
                 (bool)(*(byte *)((long)&isEnableds[lVar9].description + 4) & 1));
      verifier_1._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&_verifierNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    }
    verifier._4_4_ = verifier._4_4_ + 1;
    pvVar7 = (void *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 4) {
    local_1d8 = normalVerifiers[(long)(int)(uint)verifier_1 + -1];
    this_06 = (ColorMaskTestCase *)operator_new(0xa0);
    pSVar2 = local_1d8;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"color_writemask",
               (allocator<char> *)((long)&verifier_2 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1d8);
    std::operator+(&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::ColorMaskTestCase::ColorMaskTestCase
              (this_06,pCVar1,pSVar2,pcVar8,"COLOR_WRITEMASK");
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_1;
  }
  verifier_2._0_4_ = 0;
  while ((int)(uint)verifier_2 < 4) {
    local_228 = normalVerifiers[(long)(int)(uint)verifier_2 + -1];
    this_07 = (DepthWriteMaskTestCase *)operator_new(0xa0);
    pSVar2 = local_228;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"depth_writemask",
               (allocator<char> *)((long)&verifier_3 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_228);
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::DepthWriteMaskTestCase::DepthWriteMaskTestCase
              (this_07,pCVar1,pSVar2,pcVar8,"DEPTH_WRITEMASK");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
    verifier_2._0_4_ = (uint)verifier_2 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_2;
  }
  verifier_3._0_4_ = 0;
  while ((int)(uint)verifier_3 < 4) {
    local_278 = normalVerifiers[(long)(int)(uint)verifier_3 + -1];
    this_08 = (SampleCoverageInvertTestCase *)operator_new(0xa0);
    pSVar2 = local_278;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"sample_coverage_invert",
               (allocator<char> *)((long)&verifier_4 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_278);
    std::operator+(&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::SampleCoverageInvertTestCase::SampleCoverageInvertTestCase
              (this_08,pCVar1,pSVar2,pcVar8,"SAMPLE_COVERAGE_INVERT");
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
    verifier_3._0_4_ = (uint)verifier_3 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_3;
  }
  verifier_4._0_4_ = 0;
  while ((int)(uint)verifier_4 < 4) {
    local_2c8 = normalVerifiers[(long)(int)(uint)verifier_4 + -1];
    pIVar10 = (InitialBooleanTestCase *)operator_new(0xa8);
    pSVar2 = local_2c8;
    verifier_5._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_5,"shader_compiler",
               (allocator<char> *)((long)&verifier_5 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_2c8);
    std::operator+(&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_5,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar10,pCVar1,pSVar2,pcVar8,"SHADER_COMPILER",0x8dfa,true);
    verifier_5._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar10);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&_verifierNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_5 + 7));
    verifier_4._0_4_ = (uint)verifier_4 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_4;
  }
  verifier_5._0_4_ = 0;
  while ((int)(uint)verifier_5 < 4) {
    local_318 = normalVerifiers[(long)(int)(uint)verifier_5 + -1];
    pIVar10 = (InitialBooleanTestCase *)operator_new(0xa8);
    pSVar2 = local_318;
    verifier_6._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_6,"transform_feedback_active_initial",
               (allocator<char> *)((long)&verifier_6 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_318);
    std::operator+(&local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_6,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar10,pCVar1,pSVar2,pcVar8,"initial TRANSFORM_FEEDBACK_ACTIVE",0x8e24,false);
    verifier_6._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar10);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&_verifierNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_6 + 7));
    verifier_5._0_4_ = (uint)verifier_5 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_5;
  }
  verifier_6._0_4_ = 0;
  while ((int)(uint)verifier_6 < 4) {
    local_368 = normalVerifiers[(long)(int)(uint)verifier_6 + -1];
    pIVar10 = (InitialBooleanTestCase *)operator_new(0xa8);
    pSVar2 = local_368;
    verifier_7._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_7,"transform_feedback_paused_initial",
               (allocator<char> *)((long)&verifier_7 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_368);
    std::operator+(&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_7,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar10,pCVar1,pSVar2,pcVar8,"initial TRANSFORM_FEEDBACK_PAUSED",0x8e23,false);
    verifier_7._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar10);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&_verifierNdx_7);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_7 + 7));
    verifier_6._0_4_ = (uint)verifier_6 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_6;
  }
  verifier_7._0_4_ = 0;
  while ((int)(uint)verifier_7 < 4) {
    local_3b8 = normalVerifiers[(long)(int)(uint)verifier_7 + -1];
    pTVar11 = (TestNode *)operator_new(0xa8);
    pSVar2 = local_3b8;
    verifier_8._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_8,"transform_feedback",
               (allocator<char> *)((long)&verifier_8 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_3b8);
    std::operator+(&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::TransformFeedbackBasicTestCase::TransformFeedbackBasicTestCase
              ((TransformFeedbackBasicTestCase *)pTVar11,pCVar1,pSVar2,pcVar8);
    verifier_8._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar11);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&_verifierNdx_8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_8 + 7));
    verifier_7._0_4_ = (uint)verifier_7 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_7;
  }
  verifier_8._0_4_ = 0;
  while ((int)(uint)verifier_8 < 4) {
    local_408 = normalVerifiers[(long)(int)(uint)verifier_8 + -1];
    pTVar11 = (TestNode *)operator_new(0xa8);
    pSVar2 = local_408;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"transform_feedback_implicit_resume",&local_449);
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_408);
    std::operator+(&local_428,&local_448,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::TransformFeedbackImplicitResumeTestCase::
    TransformFeedbackImplicitResumeTestCase
              ((TransformFeedbackImplicitResumeTestCase *)pTVar11,pCVar1,pSVar2,pcVar8);
    tcu::TestNode::addChild((TestNode *)this,pTVar11);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    verifier_8._0_4_ = (uint)verifier_8 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_8;
  }
  return (int)pvVar7;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};
	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "primitive_restart_fixed_index",	"PRIMITIVE_RESTART_FIXED_INDEX",	GL_PRIMITIVE_RESTART_FIXED_INDEX,	false},
		{ "rasterizer_discard",				"RASTERIZER_DISCARD",				GL_RASTERIZER_DISCARD,				false},
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
	{
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER",						GL_SHADER_COMPILER, true)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_active_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_ACTIVE",		GL_TRANSFORM_FEEDBACK_ACTIVE, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_paused_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_PAUSED",		GL_TRANSFORM_FEEDBACK_PAUSED, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackBasicTestCase				(m_context, verifier, (std::string("transform_feedback")					+ verifier->getTestNamePostfix()).c_str())));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackImplicitResumeTestCase		(m_context, verifier, (std::string("transform_feedback_implicit_resume")	+ verifier->getTestNamePostfix()).c_str())));
}